

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_popup_begin(nk_context *ctx,nk_popup_type type,char *title,nk_flags flags,nk_rect rect)

{
  float fVar1;
  float fVar2;
  nk_window *win_00;
  nk_buffer *pnVar3;
  nk_handle nVar4;
  nk_size nVar5;
  nk_size nVar6;
  nk_rect r;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  nk_hash nVar11;
  nk_bool nVar12;
  nk_panel *pnVar13;
  nk_flags in_ECX;
  char *in_RDX;
  int in_ESI;
  nk_context *in_RDI;
  float in_XMM0_Da;
  float in_XMM0_Db;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  nk_panel *root_1;
  nk_panel *root;
  nk_size allocated;
  nk_hash title_hash;
  int title_len;
  nk_panel *panel;
  nk_window *win;
  nk_window *popup;
  nk_panel_type in_stack_000000cc;
  char *in_stack_000000d0;
  nk_context *in_stack_000000d8;
  nk_context *in_stack_ffffffffffffff88;
  nk_command_buffer *in_stack_ffffffffffffff90;
  nk_panel *in_stack_ffffffffffffff98;
  nk_context *ctx_00;
  nk_window *local_40;
  undefined8 local_14;
  nk_bool local_4;
  
  if (((in_RDI == (nk_context *)0x0) || (in_RDI->current == (nk_window *)0x0)) ||
     (in_RDI->current->layout == (nk_panel *)0x0)) {
    local_4 = 0;
  }
  else {
    win_00 = in_RDI->current;
    iVar10 = nk_strlen(in_RDX);
    nVar11 = nk_murmur_hash(in_RDX,iVar10,4);
    local_40 = (win_00->popup).win;
    if (local_40 == (nk_window *)0x0) {
      local_40 = (nk_window *)nk_create_window(in_stack_ffffffffffffff88);
      local_40->parent = win_00;
      (win_00->popup).win = local_40;
      (win_00->popup).active = 0;
      (win_00->popup).type = NK_PANEL_POPUP;
    }
    if ((win_00->popup).name != nVar11) {
      if ((win_00->popup).active != 0) {
        return 0;
      }
      nk_zero(in_stack_ffffffffffffff90,(nk_size)in_stack_ffffffffffffff88);
      (win_00->popup).name = nVar11;
      (win_00->popup).active = 1;
      (win_00->popup).type = NK_PANEL_POPUP;
    }
    in_RDI->current = local_40;
    fVar1 = (win_00->layout->clip).x;
    fVar2 = (win_00->layout->clip).y;
    local_40->parent = win_00;
    (local_40->bounds).x = fVar1 + in_XMM0_Da;
    (local_40->bounds).y = fVar2 + in_XMM0_Db;
    (local_40->bounds).w = (float)in_XMM1_Da;
    (local_40->bounds).h = (float)in_XMM1_Db;
    local_40->seq = in_RDI->seq;
    pnVar13 = (nk_panel *)nk_create_panel(in_stack_ffffffffffffff88);
    local_40->layout = pnVar13;
    local_40->flags = in_ECX;
    local_40->flags = local_40->flags | 1;
    if (in_ESI == 1) {
      local_40->flags = local_40->flags | 0x800;
    }
    pnVar3 = (win_00->buffer).base;
    fVar8 = (win_00->buffer).clip.x;
    fVar9 = (win_00->buffer).clip.y;
    fVar1 = (win_00->buffer).clip.w;
    fVar2 = (win_00->buffer).clip.h;
    iVar10 = (win_00->buffer).use_clipping;
    uVar7 = *(undefined4 *)&(win_00->buffer).field_0x1c;
    nVar4 = (win_00->buffer).userdata;
    nVar5 = (win_00->buffer).begin;
    nVar6 = (win_00->buffer).last;
    (local_40->buffer).end = (win_00->buffer).end;
    (local_40->buffer).last = nVar6;
    (local_40->buffer).userdata = nVar4;
    (local_40->buffer).begin = nVar5;
    (local_40->buffer).clip.w = fVar1;
    (local_40->buffer).clip.h = fVar2;
    (local_40->buffer).use_clipping = iVar10;
    *(undefined4 *)&(local_40->buffer).field_0x1c = uVar7;
    (local_40->buffer).base = pnVar3;
    (local_40->buffer).clip.x = fVar8;
    (local_40->buffer).clip.y = fVar9;
    nk_start_popup(in_RDI,win_00);
    ctx_00 = (nk_context *)(in_RDI->memory).allocated;
    r._8_8_ = ctx_00;
    r._0_8_ = in_stack_ffffffffffffff98;
    nk_push_scissor(in_stack_ffffffffffffff90,r);
    nVar12 = nk_panel_begin(in_stack_000000d8,in_stack_000000d0,in_stack_000000cc);
    if (nVar12 == 0) {
      for (pnVar13 = win_00->layout; pnVar13 != (nk_panel *)0x0; pnVar13 = pnVar13->parent) {
        pnVar13->flags = pnVar13->flags | 0x10000;
      }
      (win_00->popup).buf.active = 0;
      (win_00->popup).active = 0;
      (in_RDI->memory).allocated = (nk_size)ctx_00;
      in_RDI->current = win_00;
      nk_free_panel(ctx_00,in_stack_ffffffffffffff98);
      local_40->layout = (nk_panel *)0x0;
      local_4 = 0;
    }
    else {
      for (pnVar13 = win_00->layout; pnVar13 != (nk_panel *)0x0; pnVar13 = pnVar13->parent) {
        pnVar13->flags = pnVar13->flags | 0x1000;
        pnVar13->flags = pnVar13->flags & 0xfffeffff;
      }
      (win_00->popup).active = 1;
      local_40->layout->offset_x = &(local_40->scrollbar).x;
      local_40->layout->offset_y = &(local_40->scrollbar).y;
      local_40->layout->parent = win_00->layout;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

NK_API nk_bool
nk_popup_begin(struct nk_context *ctx, enum nk_popup_type type,
const char *title, nk_flags flags, struct nk_rect rect)
{
struct nk_window *popup;
struct nk_window *win;
struct nk_panel *panel;

int title_len;
nk_hash title_hash;
nk_size allocated;

NK_ASSERT(ctx);
NK_ASSERT(title);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return 0;

win = ctx->current;
panel = win->layout;
NK_ASSERT(!(panel->type & NK_PANEL_SET_POPUP) && "popups are not allowed to have popups");
(void)panel;
title_len = (int)nk_strlen(title);
title_hash = nk_murmur_hash(title, (int)title_len, NK_PANEL_POPUP);

popup = win->popup.win;
if (!popup) {
popup = (struct nk_window*)nk_create_window(ctx);
popup->parent = win;
win->popup.win = popup;
win->popup.active = 0;
win->popup.type = NK_PANEL_POPUP;
}

/* make sure we have correct popup */
if (win->popup.name != title_hash) {
if (!win->popup.active) {
nk_zero(popup, sizeof(*popup));
win->popup.name = title_hash;
win->popup.active = 1;
win->popup.type = NK_PANEL_POPUP;
} else return 0;
}

/* popup position is local to window */
ctx->current = popup;
rect.x += win->layout->clip.x;
rect.y += win->layout->clip.y;

/* setup popup data */
popup->parent = win;
popup->bounds = rect;
popup->seq = ctx->seq;
popup->layout = (struct nk_panel*)nk_create_panel(ctx);
popup->flags = flags;
popup->flags |= NK_WINDOW_BORDER;
if (type == NK_POPUP_DYNAMIC)
popup->flags |= NK_WINDOW_DYNAMIC;

popup->buffer = win->buffer;
nk_start_popup(ctx, win);
allocated = ctx->memory.allocated;
nk_push_scissor(&popup->buffer, nk_null_rect);

if (nk_panel_begin(ctx, title, NK_PANEL_POPUP)) {
/* popup is running therefore invalidate parent panels */
struct nk_panel *root;
root = win->layout;
while (root) {
root->flags |= NK_WINDOW_ROM;
root->flags &= ~(nk_flags)NK_WINDOW_REMOVE_ROM;
root = root->parent;
}
win->popup.active = 1;
popup->layout->offset_x = &popup->scrollbar.x;
popup->layout->offset_y = &popup->scrollbar.y;
popup->layout->parent = win->layout;
return 1;
} else {
/* popup was closed/is invalid so cleanup */
struct nk_panel *root;
root = win->layout;
while (root) {
root->flags |= NK_WINDOW_REMOVE_ROM;
root = root->parent;
}
win->popup.buf.active = 0;
win->popup.active = 0;
ctx->memory.allocated = allocated;
ctx->current = win;
nk_free_panel(ctx, popup->layout);
popup->layout = 0;
return 0;
}
}